

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

ClientMetric * __thiscall
prometheus::Histogram::Collect(ClientMetric *__return_storage_ptr__,Histogram *this)

{
  vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  *this_00;
  pointer pCVar1;
  pointer pdVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  uint64_t uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Bucket local_40;
  
  std::mutex::lock(&this->mutex_);
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->counter).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->gauge).value = 0.0;
  (__return_storage_ptr__->info).value = 1.0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  this_00 = &(__return_storage_ptr__->histogram).bucket;
  std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>::
  reserve(this_00,(long)(this->bucket_counts_).
                        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->bucket_counts_).
                        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar5 = 0;
  uVar6 = 0;
  for (uVar4 = 0;
      pCVar1 = (this->bucket_counts_).
               super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->bucket_counts_).
                            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3);
      uVar4 = uVar4 + 1) {
    dVar7 = Counter::Value((Counter *)((long)&(pCVar1->gauge_).value_._M_i + lVar5));
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    dVar7 = dVar7 + (auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
    uVar3 = (ulong)dVar7;
    uVar6 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    pdVar2 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40.upper_bound = INFINITY;
    if (uVar4 != (long)(this->bucket_boundaries_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) {
      local_40.upper_bound = *(double *)((long)pdVar2 + lVar5);
    }
    local_40.cumulative_count = uVar6;
    std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
    ::emplace_back<prometheus::ClientMetric::Bucket>(this_00,&local_40);
    lVar5 = lVar5 + 8;
  }
  (__return_storage_ptr__->histogram).sample_count = uVar6;
  dVar7 = Gauge::Value(&this->sum_);
  (__return_storage_ptr__->histogram).sample_sum = dVar7;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Histogram::Collect() const {
  std::lock_guard<std::mutex> lock(mutex_);

  auto metric = ClientMetric{};

  auto cumulative_count = 0ULL;
  metric.histogram.bucket.reserve(bucket_counts_.size());
  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    cumulative_count += bucket_counts_[i].Value();
    auto bucket = ClientMetric::Bucket{};
    bucket.cumulative_count = cumulative_count;
    bucket.upper_bound = (i == bucket_boundaries_.size()
                              ? std::numeric_limits<double>::infinity()
                              : bucket_boundaries_[i]);
    metric.histogram.bucket.push_back(std::move(bucket));
  }
  metric.histogram.sample_count = cumulative_count;
  metric.histogram.sample_sum = sum_.Value();

  return metric;
}